

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O3

void emit_loadu64(ASMState *as,Reg r,uint64_t u64)

{
  byte bVar1;
  MCode *p;
  MCode *pMVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = (int)u64;
  if (u64 >> 0x20 == 0) {
    emit_loadi(as,r,iVar3);
    return;
  }
  bVar1 = (byte)r;
  if ((long)iVar3 == u64) {
    pMVar2 = as->mcp;
    *(int *)(pMVar2 + -4) = iVar3;
    pMVar2[-5] = bVar1 & 7 | 0xc0;
    pMVar2[-6] = 199;
    bVar1 = bVar1 >> 3 & 1;
  }
  else {
    lVar4 = (u64 - (long)as->J) + -0xca8;
    iVar3 = (int)lVar4;
    if (iVar3 == lVar4) {
      emit_rmro(as,XO_LEA,r | 0x80200,0xe,iVar3);
      return;
    }
    pMVar2 = as->mcp;
    iVar3 = (int)(u64 - (long)pMVar2);
    if (((long)iVar3 != u64 - (long)pMVar2) || ((u64 + 0x80000000) - (long)as->mctop >> 0x20 != 0))
    {
      *(uint64_t *)(pMVar2 + -8) = u64;
      pMVar2[-9] = bVar1 & 7 | 0xb8;
      pMVar2[-10] = bVar1 >> 3 & 1 | 0x48;
      pMVar2 = pMVar2 + -10;
      goto LAB_0013bf72;
    }
    *(int *)(pMVar2 + -4) = iVar3;
    pMVar2[-5] = bVar1 * '\b' & 0x38 | 5;
    pMVar2[-6] = 0x8d;
    bVar1 = (byte)(r >> 0x10) | (byte)(r >> 1) & 4;
  }
  pMVar2[-7] = bVar1 | 0x48;
  pMVar2 = pMVar2 + -7;
LAB_0013bf72:
  as->mcp = pMVar2;
  return;
}

Assistant:

static void emit_loadu64(ASMState *as, Reg r, uint64_t u64)
{
  if (checku32(u64)) {  /* 32 bit load clears upper 32 bits. */
    emit_loadi(as, r, (int32_t)u64);
  } else if (checki32((int64_t)u64)) {  /* Sign-extended 32 bit load. */
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = (int32_t)u64;
    as->mcp = emit_opm(XO_MOVmi, XM_REG, REX_64, r, p, -4);
#if LJ_GC64
  } else if (checki32(dispofs(as, u64))) {
    emit_rmro(as, XO_LEA, r|REX_64, RID_DISPATCH, (int32_t)dispofs(as, u64));
  } else if (checki32(mcpofs(as, u64)) && checki32(mctopofs(as, u64))) {
    /* Since as->realign assumes the code size doesn't change, check
    ** RIP-relative addressing reachability for both as->mcp and as->mctop.
    */
    emit_rmro(as, XO_LEA, r|REX_64, RID_RIP, (int32_t)mcpofs(as, u64));
#endif
  } else {  /* Full-size 64 bit load. */
    MCode *p = as->mcp;
    *(uint64_t *)(p-8) = u64;
    p[-9] = (MCode)(XI_MOVri+(r&7));
    p[-10] = 0x48 + ((r>>3)&1);
    p -= 10;
    as->mcp = p;
  }
}